

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_4x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  uint3 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined4 *puVar13;
  ushort uVar15;
  undefined1 auVar14 [16];
  int val_1;
  int val;
  __m128i tmp_1;
  __m128i tmp;
  __m128i cvtepi32_epi8_3;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i weighted_left_y_3;
  __m128i cvtepi32_epi8_2;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i weighted_left_y_2;
  __m128i cvtepi32_epi8_1;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i weighted_left_y_1;
  __m128i cvtepi32_epi8;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_left_y;
  int val_2;
  int val_3;
  int val_4;
  int val_5;
  undefined2 local_7f8;
  undefined2 uStack_7f4;
  undefined2 uStack_7ec;
  undefined1 local_718;
  undefined1 uStack_717;
  undefined1 uStack_716;
  undefined1 uStack_715;
  undefined2 local_648;
  undefined2 uStack_644;
  undefined2 uStack_63c;
  undefined2 local_588;
  undefined2 uStack_584;
  undefined2 uStack_57c;
  undefined2 local_4c8;
  undefined2 uStack_4c4;
  undefined2 uStack_4bc;
  undefined2 local_408;
  undefined2 uStack_404;
  undefined2 uStack_400;
  undefined2 uStack_3fc;
  undefined4 uStack_344;
  undefined4 uStack_33c;
  undefined4 uStack_334;
  undefined4 uStack_32c;
  undefined4 uStack_304;
  undefined4 uStack_2fc;
  undefined4 uStack_2f4;
  undefined4 uStack_2ec;
  undefined4 uStack_2c4;
  undefined4 uStack_2bc;
  undefined4 uStack_2b4;
  undefined4 uStack_2ac;
  undefined4 uStack_284;
  undefined4 uStack_27c;
  undefined4 uStack_274;
  undefined4 uStack_26c;
  undefined4 local_118;
  undefined4 local_c8;
  __m128i left_y;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i left;
  __m128i top_right;
  
  bVar1 = *(byte *)(in_RDX + 3);
  uVar2 = *in_RCX;
  local_718 = (byte)uVar2;
  uStack_717 = (byte)((uint)uVar2 >> 8);
  uStack_716 = (byte)((uint)uVar2 >> 0x10);
  uStack_715 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(uStack_717,(ushort)local_718);
  local_7f8 = (ushort)bVar1;
  uStack_7f4 = (ushort)bVar1;
  uStack_7ec = (ushort)bVar1;
  uStack_7f4 = uStack_7f4 * 0x6b;
  uVar15 = local_7f8 * 0xab;
  uStack_7ec = uStack_7ec * 0xc0;
  uVar11 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar12 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_408 = (short)uVar11;
  uStack_404 = (short)(uVar11 >> 0x20);
  uStack_400 = (short)uVar12;
  uStack_3fc = (short)(uVar12 >> 0x20);
  uStack_334 = (uint)uStack_7f4;
  uStack_32c = (uint)uStack_7ec;
  uStack_344 = (uint)(ushort)(uStack_404 * 0x95);
  uStack_33c = (uint)(ushort)(uStack_3fc * 0x40);
  auVar10._4_4_ = uStack_334 + uStack_344 + 0x800080 >> 8;
  auVar10._0_4_ = (uint)local_7f8 + (uint)(ushort)(local_408 * 0xff) + 0x800080 >> 8;
  auVar10._12_4_ = uStack_32c + uStack_33c + 0x800080 >> 8;
  auVar10._8_4_ = (uint)uVar15 + (uint)(ushort)(uStack_400 * 0x55) + 0x800080 >> 8;
  auVar9._8_8_ = 0xc0804000c080400;
  auVar9._0_8_ = 0xc0804000c080400;
  auVar14 = pshufb(auVar10,auVar9);
  local_118 = auVar14._0_4_;
  *in_RDI = local_118;
  local_4c8 = (ushort)uStack_717;
  uStack_4c4 = (ushort)uStack_717;
  uStack_4bc = (ushort)uStack_717;
  uStack_2f4 = (uint)uStack_7f4;
  uStack_2ec = (uint)uStack_7ec;
  uStack_304 = (uint)(ushort)(uStack_4c4 * 0x95);
  uStack_2fc = (uint)(ushort)(uStack_4bc * 0x40);
  auVar8._4_4_ = uStack_2f4 + uStack_304 + 0x800080 >> 8;
  auVar8._0_4_ = (uint)local_7f8 + (uint)(ushort)(local_4c8 * 0xff) + 0x800080 >> 8;
  auVar8._12_4_ = uStack_2ec + uStack_2fc + 0x800080 >> 8;
  auVar8._8_4_ = (uint)uVar15 + (uint)(ushort)(local_4c8 * 0x55) + 0x800080 >> 8;
  auVar7._8_8_ = 0xc0804000c080400;
  auVar7._0_8_ = 0xc0804000c080400;
  auVar14 = pshufb(auVar8,auVar7);
  local_c8 = auVar14._0_4_;
  *(undefined4 *)((long)in_RDI + in_RSI) = local_c8;
  puVar13 = (undefined4 *)((long)in_RDI + in_RSI + in_RSI);
  local_588 = (ushort)uStack_716;
  uStack_584 = (ushort)uStack_716;
  uStack_57c = (ushort)uStack_716;
  uStack_2b4 = (uint)uStack_7f4;
  uStack_2ac = (uint)uStack_7ec;
  uStack_2c4 = (uint)(ushort)(uStack_584 * 0x95);
  uStack_2bc = (uint)(ushort)(uStack_57c * 0x40);
  auVar6._4_4_ = uStack_2b4 + uStack_2c4 + 0x800080 >> 8;
  auVar6._0_4_ = (uint)local_7f8 + (uint)(ushort)(local_588 * 0xff) + 0x800080 >> 8;
  auVar6._12_4_ = uStack_2ac + uStack_2bc + 0x800080 >> 8;
  auVar6._8_4_ = (uint)uVar15 + (uint)(ushort)(local_588 * 0x55) + 0x800080 >> 8;
  auVar5._8_8_ = 0xc0804000c080400;
  auVar5._0_8_ = 0xc0804000c080400;
  auVar14 = pshufb(auVar6,auVar5);
  left_y[1]._0_4_ = auVar14._0_4_;
  *puVar13 = (undefined4)left_y[1];
  local_648 = (ushort)uStack_715;
  uStack_644 = (ushort)uStack_715;
  uStack_63c = (ushort)uStack_715;
  uStack_274 = (uint)uStack_7f4;
  uStack_26c = (uint)uStack_7ec;
  uStack_284 = (uint)(ushort)(uStack_644 * 0x95);
  uStack_27c = (uint)(ushort)(uStack_63c * 0x40);
  auVar4._4_4_ = uStack_274 + uStack_284 + 0x800080 >> 8;
  auVar4._0_4_ = (uint)local_7f8 + (uint)(ushort)(local_648 * 0xff) + 0x800080 >> 8;
  auVar4._12_4_ = uStack_26c + uStack_27c + 0x800080 >> 8;
  auVar4._8_4_ = (uint)uVar15 + (uint)(ushort)(local_648 * 0x55) + 0x800080 >> 8;
  auVar14._8_8_ = 0xc0804000c080400;
  auVar14._0_8_ = 0xc0804000c080400;
  auVar14 = pshufb(auVar4,auVar14);
  weights[1]._0_4_ = auVar14._0_4_;
  *(undefined4 *)((long)puVar13 + in_RSI) = (undefined4)weights[1];
  return;
}

Assistant:

void aom_smooth_h_predictor_4x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i left = cvtepu8_epi32(Load4(left_column));
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}